

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O1

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  Tensor *pTVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  runtime_error *this_00;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ushort uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  uint uVar43;
  uint uVar44;
  CoeffReturnType CVar45;
  int iVar46;
  uint uVar47;
  uint uVar48;
  SumReducer<float> reducer;
  type local_158;
  int local_140 [7];
  uint local_124;
  uint local_120;
  _Type local_118;
  undefined1 local_110 [16];
  pointer local_100;
  Device *local_f8;
  undefined4 local_f0;
  type *local_e8;
  _Type alStack_e0;
  DefaultDevice *local_d8;
  float *local_d0;
  array<Index,_NumPreservedStrides> local_c8;
  type *local_c0;
  _Type local_b8;
  array<Index,_NumReducedDims> local_b0;
  array<Index,_NumReducedDims> local_a8;
  DefaultDevice *local_a0;
  float *local_98;
  float *local_90;
  Dimensions local_88;
  DefaultDevice *local_80;
  float *local_78;
  Dimensions local_70;
  DefaultDevice *local_68;
  EvaluatorPointerType local_58;
  DefaultDevice *local_50;
  type local_40;
  
  pTVar1 = *(xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if ((1 < (pTVar1->d).nd) && ((pTVar1->d).d[1] != 1)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"LogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_120 = (fx->d).bd;
  local_118[0] = (long)(this->super_Node).aux_mem;
  uVar43 = 1;
  local_140[0] = 1;
  local_124 = 1;
  local_110 = (undefined1  [16])0x0;
  local_100 = (pointer)0x0;
  local_f8 = fx->device;
  local_f0 = 0;
  if ((DefaultDevice *)(long)(int)local_120 != (DefaultDevice *)0x1) {
    uVar44 = (fx->d).nd;
    uVar8 = (ulong)uVar44;
    if (uVar8 == 0) {
LAB_0034d728:
      if (uVar43 != (fx->d).d[0]) goto LAB_0034e424;
    }
    else if (uVar44 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar10 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
        auVar19._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar19._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar19._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar19._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar19._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar19._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar19._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar19._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar19._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar19._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar19._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar19._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar19._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar19._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar19._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar19._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar19,auVar18);
        uVar10 = uVar10 + 0x10;
      } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar15._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar15._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar15._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar15._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar15._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar15._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar15._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar15._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar15._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar15._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar15._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar15._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar15._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar15._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar15._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar15._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar15,1);
      auVar14 = vpmulld_avx512f(auVar15,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar43 = auVar3._0_4_;
      goto LAB_0034d728;
    }
    uVar44 = 1;
    uVar43 = 1;
    if (uVar8 != 0) {
      uVar43 = (fx->d).d[0];
    }
    uVar47 = (dEdf->d).nd;
    uVar8 = (ulong)uVar47;
    if (uVar8 == 0) {
LAB_0034d80a:
      if (uVar44 != (dEdf->d).d[0]) goto LAB_0034e424;
    }
    else if (uVar47 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar10 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar10));
        auVar23._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar23._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar23._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar23._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar23._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar23._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar23._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar23._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar23._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar23._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar23._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar23._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar23._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar23._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar23._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar23._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar23,auVar18);
        uVar10 = uVar10 + 0x10;
      } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar16._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar16._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar16._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar16._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar16._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar16._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar16._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar16._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar16._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar16._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar16._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar16._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar16._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar16._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar16._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar16._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar16,1);
      auVar14 = vpmulld_avx512f(auVar16,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar44 = auVar3._0_4_;
      goto LAB_0034d80a;
    }
    uVar44 = 1;
    if (uVar8 != 0) {
      uVar44 = (dEdf->d).d[0];
    }
    local_e8 = (type *)fx->v;
    alStack_e0[0] = (long)(int)uVar43;
    local_d8 = (DefaultDevice *)(long)(int)local_120;
    local_d0 = dEdf->v;
    local_c8._M_elems[0] = (_Type)(_Type)(long)(int)uVar44;
    local_c0 = (type *)(long)(int)(dEdf->d).bd;
    local_b0._M_elems[0] = (_Type)((ulong)local_b0._M_elems[0] & 0xffffffff00000000);
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    lVar11 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_140 + lVar11));
      auVar24._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar24._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar24._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar24._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar24._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar24._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar24._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar24._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar24._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar24._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar24._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar24._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar24._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar24._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar24._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar24._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar24,auVar18);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar17._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar17._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar17._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar17._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar17._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar17._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar17._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar17._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar17._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar17._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar17._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar17._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar17._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar17._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar17._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar17._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar17,1);
    auVar14 = vpmulld_avx512f(auVar17,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    if (auVar3._0_4_ != 1) {
      __assert_fail("d.batch_size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xe4,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::tb()");
    }
    local_40.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)local_120;
    local_158.m_data = (StoragePointerType)&local_40;
    local_158.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_e8;
    local_40.m_data = (StoragePointerType)local_118[0];
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>_>,_Eigen::DefaultDevice,_false,_(Eigen::internal::TiledEvaluation)0>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>_>
           *)&local_158,dev->edevice);
    uVar43 = (fx->d).d[0];
    uVar8 = (ulong)uVar43;
    uVar44 = (fx->d).nd;
    uVar10 = (ulong)uVar44;
    if (uVar10 == 0) {
      uVar44 = 1;
LAB_0034dcbb:
      if (uVar44 != uVar43) goto LAB_0034e424;
    }
    else if (uVar44 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar9 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar9));
        auVar25._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar25._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar25._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar25._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar25._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar25._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar25._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar25._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar25._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar25._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar25._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar25._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar25._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar25._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar25._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar25._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar25,auVar18);
        uVar9 = uVar9 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar26._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar26._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar26._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar26._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar26._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar26._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar26._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar26._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar26._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar26._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar26._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar26._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar26._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar26._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar26._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar26._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar26,1);
      auVar14 = vpmulld_avx512f(auVar26,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar44 = auVar3._0_4_;
      goto LAB_0034dcbb;
    }
    iVar46 = 1;
    if (uVar10 == 0) {
      uVar43 = 1;
    }
    uVar10 = (ulong)local_124;
    if (uVar10 == 0) {
LAB_0034dd9f:
      if (iVar46 != local_140[0]) goto LAB_0034e49a;
    }
    else if (local_124 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar9 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_140 + uVar9));
        auVar31._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar31._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar31._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar31._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar31._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar31._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar31._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar31._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar31._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar31._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar31._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar31._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar31._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar31._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar31._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar31._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar31,auVar18);
        uVar9 = uVar9 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar32._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar32._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar32._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar32._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar32._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar32._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar32._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar32._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar32._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar32._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar32._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar32._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar32._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar32._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar32._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar32._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar32,1);
      auVar14 = vpmulld_avx512f(auVar32,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      iVar46 = auVar3._0_4_;
      goto LAB_0034dd9f;
    }
    uVar44 = 1;
    iVar46 = 1;
    if (uVar10 != 0) {
      iVar46 = local_140[0];
    }
    local_a0 = (DefaultDevice *)(long)(int)local_120;
    uVar47 = (dEdf->d).nd;
    uVar10 = (ulong)uVar47;
    if (uVar10 == 0) {
LAB_0034de93:
      if (uVar44 != (dEdf->d).d[0]) {
LAB_0034e424:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xf0,
                      "const Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb() const");
      }
    }
    else if (uVar47 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar9 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar9));
        auVar33._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar33._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar33._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar33._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar33._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar33._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar33._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar33._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar33._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar33._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar33._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar33._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar33._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar33._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar33._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar33._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar33,auVar18);
        uVar9 = uVar9 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar34._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar34._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar34._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar34._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar34._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar34._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar34._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar34._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar34._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar34._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar34._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar34._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar34._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar34._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar34._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar34._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar34,1);
      auVar14 = vpmulld_avx512f(auVar34,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar44 = auVar3._0_4_;
      goto LAB_0034de93;
    }
    uVar47 = 1;
    uVar44 = 1;
    if (uVar10 != 0) {
      uVar44 = (dEdf->d).d[0];
    }
    local_80 = (DefaultDevice *)dEdf->v;
    local_70.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)(dEdf->d).bd;
    uVar48 = (dEdxi->d).nd;
    uVar10 = (ulong)uVar48;
    if (uVar10 == 0) {
LAB_0034df7f:
      if (uVar47 != (dEdxi->d).d[0]) {
LAB_0034e49a:
        __assert_fail("d.ndims() == 1 || d.batch_size() == d.rows()",
                      "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                      ,0xec,"Eigen::TensorMap<Eigen::Tensor<float, 2>> dynet::Tensor::tb()");
      }
    }
    else if (uVar48 != 1) {
      auVar14 = vpbroadcastq_avx512f();
      auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
      uVar9 = 0;
      auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar18 = vmovdqa64_avx512f(auVar15);
        auVar15 = vpbroadcastq_avx512f();
        auVar19 = vporq_avx512f(auVar15,auVar16);
        auVar15 = vporq_avx512f(auVar15,auVar17);
        uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
        bVar6 = (byte)uVar5;
        uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
        bVar7 = (byte)uVar5;
        uVar12 = CONCAT11(bVar7,bVar6);
        auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar9));
        auVar35._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
        auVar35._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
        auVar35._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
        auVar35._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
        auVar35._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
        auVar35._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
        auVar35._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
        auVar35._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
        auVar35._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
        auVar35._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
        auVar35._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
        auVar35._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
        auVar35._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
        auVar35._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
        auVar35._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
        auVar35._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
        auVar15 = vpmulld_avx512f(auVar35,auVar18);
        uVar9 = uVar9 + 0x10;
      } while ((uVar10 + 0xf & 0x1fffffff0) != uVar9);
      auVar14 = vmovdqa32_avx512f(auVar15);
      auVar36._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
      bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
      auVar36._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
      bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
      auVar36._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
      bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
      auVar36._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
      bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
      auVar36._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
      bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
      auVar36._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
      bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
      auVar36._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
      bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
      auVar36._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
      auVar36._32_4_ =
           (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
      bVar2 = (bool)(bVar7 >> 1 & 1);
      auVar36._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
      bVar2 = (bool)(bVar7 >> 2 & 1);
      auVar36._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
      bVar2 = (bool)(bVar7 >> 3 & 1);
      auVar36._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
      bVar2 = (bool)(bVar7 >> 4 & 1);
      auVar36._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
      bVar2 = (bool)(bVar7 >> 5 & 1);
      auVar36._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
      bVar2 = (bool)(bVar7 >> 6 & 1);
      auVar36._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
      auVar36._60_4_ =
           (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
      auVar13 = vextracti64x4_avx512f(auVar36,1);
      auVar14 = vpmulld_avx512f(auVar36,ZEXT3264(auVar13));
      auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
      auVar4 = vpshufd_avx(auVar3,0xee);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      auVar4 = vpshufd_avx(auVar3,0x55);
      auVar3 = vpmulld_avx(auVar3,auVar4);
      uVar47 = auVar3._0_4_;
      goto LAB_0034df7f;
    }
    local_c8._M_elems[0] = (_Type)(long)(int)uVar43;
    local_a8._M_elems[0] = (_Type)(long)iVar46;
    local_98 = (float *)(uVar8 | 0x100000000);
    local_78 = (float *)(long)(int)uVar44;
    local_158.m_data = dEdxi->v;
    uVar43 = 1;
    if (uVar10 != 0) {
      uVar43 = (dEdxi->d).d[0];
    }
    local_158.m_dimensions.super_array<long,_2>._M_elems[1] = (long)(int)(dEdxi->d).bd;
    local_158.m_dimensions.super_array<long,_2>._M_elems[0] = (long)(int)uVar43;
    local_b0._M_elems[0] = (_Type)(_Type)local_118[0];
    local_40.m_dimensions.super_array<long,_1>._M_elems[0] = (array<long,_1>)&local_e8;
    local_e8 = (type *)local_158.m_data;
    alStack_e0[0] = local_158.m_dimensions.super_array<long,_2>._M_elems[0];
    local_d8 = (DefaultDevice *)local_158.m_dimensions.super_array<long,_2>._M_elems[1];
    local_d0 = fx->v;
    local_c0 = (type *)(long)(int)(fx->d).bd;
    local_40.m_data = (StoragePointerType)&local_158;
    Eigen::internal::
    TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
    ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
           *)&local_40,dev->edevice);
    goto LAB_0034e3c6;
  }
  uVar44 = (fx->d).nd;
  uVar8 = (ulong)uVar44;
  if (uVar8 == 0) {
LAB_0034d579:
    if (local_120 * uVar43 != (fx->d).d[0]) goto LAB_0034e3e0;
  }
  else if (uVar44 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
      auVar20._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar20._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar20._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar20._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar20._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar20._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar20._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar20._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar20._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar20._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar20._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar20._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar20._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar20._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar20._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar20._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar20,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar15 = vmovdqa32_avx512f(auVar15);
    auVar14._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar14._4_4_ = (uint)bVar2 * auVar15._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar14._8_4_ = (uint)bVar2 * auVar15._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar14._12_4_ = (uint)bVar2 * auVar15._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar14._16_4_ = (uint)bVar2 * auVar15._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar14._20_4_ = (uint)bVar2 * auVar15._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar14._24_4_ = (uint)bVar2 * auVar15._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar14._28_4_ = (uint)bVar2 * auVar15._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar14._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar14._36_4_ = (uint)bVar2 * auVar15._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar14._40_4_ = (uint)bVar2 * auVar15._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar14._44_4_ = (uint)bVar2 * auVar15._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar14._48_4_ = (uint)bVar2 * auVar15._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar14._52_4_ = (uint)bVar2 * auVar15._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar14._56_4_ = (uint)bVar2 * auVar15._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar14._60_4_ =
         (uint)(bVar7 >> 7) * auVar15._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar14,1);
    auVar14 = vpmulld_avx512f(auVar14,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    uVar43 = auVar3._0_4_;
    goto LAB_0034d579;
  }
  uVar43 = 1;
  if (uVar8 != 0) {
    uVar43 = (fx->d).d[0];
  }
  if ((dEdf->d).bd != 1) goto LAB_0034e3e0;
  uVar44 = (dEdf->d).nd;
  uVar8 = (ulong)uVar44;
  if (uVar8 == 0) {
    uVar44 = 1;
LAB_0034da20:
    if (uVar44 != (dEdf->d).d[0]) goto LAB_0034e3e0;
  }
  else if (uVar44 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar10));
      auVar21._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar21._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar21._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar21._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar21._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar21._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar21._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar21._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar21._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar21._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar21._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar21._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar21._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar21._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar21._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar21._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar21,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar22._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar22._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar22._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar22._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar22._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar22._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar22._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar22._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar22._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar22._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar22._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar22._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar22._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar22._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar22._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar22._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar22,1);
    auVar14 = vpmulld_avx512f(auVar22,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    uVar44 = auVar3._0_4_;
    goto LAB_0034da20;
  }
  uVar44 = 1;
  if (uVar8 != 0) {
    uVar44 = (dEdf->d).d[0];
  }
  if (local_120 != 1) {
LAB_0034e478:
    __assert_fail("d.batch_elems() == 1 && d.size() == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                  ,0xae,"Eigen::TensorMap<Eigen::Tensor<float, 0>> dynet::Tensor::t()");
  }
  auVar14 = vpbroadcastq_avx512f();
  auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
  lVar11 = 0;
  auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
  auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  do {
    auVar18 = vmovdqa64_avx512f(auVar15);
    auVar15 = vpbroadcastq_avx512f();
    auVar19 = vporq_avx512f(auVar15,auVar16);
    auVar15 = vporq_avx512f(auVar15,auVar17);
    uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
    bVar6 = (byte)uVar5;
    uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
    bVar7 = (byte)uVar5;
    uVar12 = CONCAT11(bVar7,bVar6);
    auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_140 + lVar11));
    auVar27._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
    auVar27._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
    auVar27._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
    auVar27._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
    auVar27._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
    auVar27._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
    auVar27._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
    auVar27._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
    auVar27._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
    auVar27._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
    auVar27._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
    auVar27._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
    auVar27._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
    auVar27._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
    auVar27._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
    auVar27._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
    auVar15 = vpmulld_avx512f(auVar27,auVar18);
    lVar11 = lVar11 + 0x10;
  } while (lVar11 != 0x10);
  auVar14 = vmovdqa32_avx512f(auVar15);
  auVar28._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
  bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
  auVar28._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
  bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
  auVar28._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
  bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
  auVar28._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
  bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
  auVar28._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
  bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
  auVar28._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
  bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
  auVar28._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
  bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
  auVar28._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
  auVar28._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
  bVar2 = (bool)(bVar7 >> 1 & 1);
  auVar28._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
  bVar2 = (bool)(bVar7 >> 2 & 1);
  auVar28._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
  bVar2 = (bool)(bVar7 >> 3 & 1);
  auVar28._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
  bVar2 = (bool)(bVar7 >> 4 & 1);
  auVar28._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
  bVar2 = (bool)(bVar7 >> 5 & 1);
  auVar28._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
  bVar2 = (bool)(bVar7 >> 6 & 1);
  auVar28._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
  auVar28._60_4_ = (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
  auVar13 = vextracti64x4_avx512f(auVar28,1);
  auVar14 = vpmulld_avx512f(auVar28,ZEXT3264(auVar13));
  auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
  auVar4 = vpshufd_avx(auVar3,0xee);
  auVar3 = vpmulld_avx(auVar3,auVar4);
  auVar4 = vpshufd_avx(auVar3,0x55);
  auVar3 = vpmulld_avx(auVar3,auVar4);
  if (auVar3._0_4_ != 1) goto LAB_0034e478;
  local_c8._M_elems[0] = (_Type)(long)(int)uVar43;
  local_78 = dEdf->v;
  local_70.super_array<long,_1>._M_elems[0] = (array<long,_1>)(long)(int)uVar44;
  local_d8 = dev->edevice;
  local_e8 = (type *)local_118[0];
  local_a0 = local_d8;
  local_90 = fx->v;
  local_88.super_array<long,_1>._M_elems[0] = (array<long,_1>)(array<long,_1>)local_c8._M_elems[0];
  local_80 = local_d8;
  local_68 = local_d8;
  if (uVar43 != uVar44) {
    __assert_fail("dimensions_match(m_leftImpl.dimensions(), m_rightImpl.dimensions())",
                  "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",0x244,
                  "Eigen::TensorEvaluator<const Eigen::TensorCwiseBinaryOp<dynet::FWeightedError, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Eigen::DefaultDevice>::TensorEvaluator(const XprType &, const Device &) [Derived = const Eigen::TensorCwiseBinaryOp<dynet::FWeightedError, const Eigen::TensorMap<Eigen::Tensor<float, 1>>, const Eigen::TensorMap<Eigen::Tensor<float, 1>>>, Device = Eigen::DefaultDevice]"
                 );
  }
  local_58 = (EvaluatorPointerType)0x0;
  local_d0 = (float *)CONCAT71(local_d0._1_7_,1);
  local_b0._M_elems[0] = (_Type)1;
  local_b8[0] = (long)local_c8._M_elems[0];
  local_a8._M_elems[0] = local_c8._M_elems[0];
  local_50 = local_d8;
  CVar45 = Eigen::internal::
           InnerMostDimReducer<Eigen::TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>,_Eigen::internal::SumReducer<float>,_false,_true>
           ::reduce((TensorReductionEvaluatorBase<const_Eigen::TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                     *)&local_d0,0,(Index)local_c8._M_elems[0],(SumReducer<float> *)&local_158);
  if (local_e8 == (type *)0x0) {
    __assert_fail("m_data != __null",
                  "/usr/include/eigen3/unsupported/Eigen/CXX11/src/Tensor/TensorEvaluator.h",100,
                  "CoeffReturnType &Eigen::TensorEvaluator<Eigen::TensorMap<Eigen::Tensor<float, 0>>, Eigen::DefaultDevice>::coeffRef(Index) [Derived = Eigen::TensorMap<Eigen::Tensor<float, 0>>, Device = Eigen::DefaultDevice]"
                 );
  }
  *(CoeffReturnType *)&local_e8->m_data = CVar45;
  if (local_58 != (EvaluatorPointerType)0x0) {
    free(*(void **)(local_58 + -2));
    local_58 = (EvaluatorPointerType)0x0;
  }
  if ((fx->d).bd != 1) goto LAB_0034e3e0;
  uVar43 = (fx->d).d[0];
  uVar44 = (fx->d).nd;
  uVar8 = (ulong)uVar44;
  if (uVar8 == 0) {
    uVar44 = 1;
LAB_0034e05c:
    if (uVar44 != uVar43) goto LAB_0034e3e0;
  }
  else if (uVar44 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((fx->d).d + uVar10));
      auVar29._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar29._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar29._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar29._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar29._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar29._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar29._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar29._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar29._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar29._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar29._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar29._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar29._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar29._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar29._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar29._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar29,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar30._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar30._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar30._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar30._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar30._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar30._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar30._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar30._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar30._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar30._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar30._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar30._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar30._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar30._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar30._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar30._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar30,1);
    auVar14 = vpmulld_avx512f(auVar30,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    uVar44 = auVar3._0_4_;
    goto LAB_0034e05c;
  }
  iVar46 = 1;
  uVar44 = uVar43;
  if (uVar8 == 0) {
    uVar44 = 1;
  }
  if (local_120 != 1) goto LAB_0034e402;
  uVar8 = (ulong)local_124;
  if (uVar8 == 0) {
LAB_0034e14b:
    if (iVar46 != local_140[0]) goto LAB_0034e402;
  }
  else if (local_124 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])(local_140 + uVar10));
      auVar37._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar37._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar37._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar37._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar37._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar37._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar37._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar37._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar37._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar37._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar37._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar37._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar37._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar37._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar37._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar37._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar37,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar38._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar38._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar38._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar38._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar38._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar38._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar38._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar38._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar38._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar38._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar38._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar38._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar38._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar38._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar38._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar38._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar38,1);
    auVar14 = vpmulld_avx512f(auVar38,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    iVar46 = auVar3._0_4_;
    goto LAB_0034e14b;
  }
  iVar46 = 1;
  if (uVar8 != 0) {
    iVar46 = local_140[0];
  }
  if ((dEdf->d).bd != 1) goto LAB_0034e3e0;
  uVar47 = (dEdf->d).nd;
  uVar8 = (ulong)uVar47;
  if (uVar8 == 0) {
    uVar47 = 1;
LAB_0034e243:
    if (uVar47 != (dEdf->d).d[0]) {
LAB_0034e3e0:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xba,"const Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t() const"
                   );
    }
  }
  else if (uVar47 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdf->d).d + uVar10));
      auVar39._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar39._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar39._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar39._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar39._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar39._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar39._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar39._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar39._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar39._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar39._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar39._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar39._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar39._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar39._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar39._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar39,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar40._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar40._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar40._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar40._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar40._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar40._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar40._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar40._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar40._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar40._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar40._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar40._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar40._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar40._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar40._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar40._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar40,1);
    auVar14 = vpmulld_avx512f(auVar40,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    uVar47 = auVar3._0_4_;
    goto LAB_0034e243;
  }
  uVar47 = 1;
  if (uVar8 != 0) {
    uVar47 = (dEdf->d).d[0];
  }
  if ((dEdxi->d).bd != 1) goto LAB_0034e402;
  local_98 = dEdf->v;
  uVar48 = (dEdxi->d).nd;
  uVar8 = (ulong)uVar48;
  if (uVar8 == 0) {
    uVar48 = 1;
LAB_0034e33c:
    if (uVar48 != (dEdxi->d).d[0]) {
LAB_0034e402:
      __assert_fail("d.batch_elems() == 1 && (d.ndims() == 1 || d.size() == d.rows())",
                    "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/dynet/dynet/tensor.h"
                    ,0xb6,"Eigen::TensorMap<Eigen::Tensor<float, 1>> dynet::Tensor::t()");
    }
  }
  else if (uVar48 != 1) {
    auVar14 = vpbroadcastq_avx512f();
    auVar15 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar10 = 0;
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar17 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpbroadcastq_avx512f();
      auVar19 = vporq_avx512f(auVar15,auVar16);
      auVar15 = vporq_avx512f(auVar15,auVar17);
      uVar5 = vpcmpuq_avx512f(auVar15,auVar14,2);
      bVar6 = (byte)uVar5;
      uVar5 = vpcmpuq_avx512f(auVar19,auVar14,2);
      bVar7 = (byte)uVar5;
      uVar12 = CONCAT11(bVar7,bVar6);
      auVar15 = vmovdqu32_avx512f(*(undefined1 (*) [64])((dEdxi->d).d + uVar10));
      auVar41._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * auVar15._4_4_;
      auVar41._0_4_ = (uint)(bVar6 & 1) * auVar15._0_4_;
      auVar41._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * auVar15._8_4_;
      auVar41._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * auVar15._12_4_;
      auVar41._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * auVar15._16_4_;
      auVar41._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * auVar15._20_4_;
      auVar41._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * auVar15._24_4_;
      auVar41._28_4_ = (uint)((byte)(uVar12 >> 7) & 1) * auVar15._28_4_;
      auVar41._32_4_ = (uint)(bVar7 & 1) * auVar15._32_4_;
      auVar41._36_4_ = (uint)(bVar7 >> 1 & 1) * auVar15._36_4_;
      auVar41._40_4_ = (uint)(bVar7 >> 2 & 1) * auVar15._40_4_;
      auVar41._44_4_ = (uint)(bVar7 >> 3 & 1) * auVar15._44_4_;
      auVar41._48_4_ = (uint)(bVar7 >> 4 & 1) * auVar15._48_4_;
      auVar41._52_4_ = (uint)(bVar7 >> 5 & 1) * auVar15._52_4_;
      auVar41._56_4_ = (uint)(bVar7 >> 6 & 1) * auVar15._56_4_;
      auVar41._60_4_ = (uint)(bVar7 >> 7) * auVar15._60_4_;
      auVar15 = vpmulld_avx512f(auVar41,auVar18);
      uVar10 = uVar10 + 0x10;
    } while ((uVar8 + 0xf & 0x1fffffff0) != uVar10);
    auVar14 = vmovdqa32_avx512f(auVar15);
    auVar42._0_4_ = (uint)(bVar6 & 1) * auVar14._0_4_ | (uint)!(bool)(bVar6 & 1) * auVar18._0_4_;
    bVar2 = (bool)((byte)(uVar12 >> 1) & 1);
    auVar42._4_4_ = (uint)bVar2 * auVar14._4_4_ | (uint)!bVar2 * auVar18._4_4_;
    bVar2 = (bool)((byte)(uVar12 >> 2) & 1);
    auVar42._8_4_ = (uint)bVar2 * auVar14._8_4_ | (uint)!bVar2 * auVar18._8_4_;
    bVar2 = (bool)((byte)(uVar12 >> 3) & 1);
    auVar42._12_4_ = (uint)bVar2 * auVar14._12_4_ | (uint)!bVar2 * auVar18._12_4_;
    bVar2 = (bool)((byte)(uVar12 >> 4) & 1);
    auVar42._16_4_ = (uint)bVar2 * auVar14._16_4_ | (uint)!bVar2 * auVar18._16_4_;
    bVar2 = (bool)((byte)(uVar12 >> 5) & 1);
    auVar42._20_4_ = (uint)bVar2 * auVar14._20_4_ | (uint)!bVar2 * auVar18._20_4_;
    bVar2 = (bool)((byte)(uVar12 >> 6) & 1);
    auVar42._24_4_ = (uint)bVar2 * auVar14._24_4_ | (uint)!bVar2 * auVar18._24_4_;
    bVar2 = (bool)((byte)(uVar12 >> 7) & 1);
    auVar42._28_4_ = (uint)bVar2 * auVar14._28_4_ | (uint)!bVar2 * auVar18._28_4_;
    auVar42._32_4_ = (uint)(bVar7 & 1) * auVar14._32_4_ | (uint)!(bool)(bVar7 & 1) * auVar18._32_4_;
    bVar2 = (bool)(bVar7 >> 1 & 1);
    auVar42._36_4_ = (uint)bVar2 * auVar14._36_4_ | (uint)!bVar2 * auVar18._36_4_;
    bVar2 = (bool)(bVar7 >> 2 & 1);
    auVar42._40_4_ = (uint)bVar2 * auVar14._40_4_ | (uint)!bVar2 * auVar18._40_4_;
    bVar2 = (bool)(bVar7 >> 3 & 1);
    auVar42._44_4_ = (uint)bVar2 * auVar14._44_4_ | (uint)!bVar2 * auVar18._44_4_;
    bVar2 = (bool)(bVar7 >> 4 & 1);
    auVar42._48_4_ = (uint)bVar2 * auVar14._48_4_ | (uint)!bVar2 * auVar18._48_4_;
    bVar2 = (bool)(bVar7 >> 5 & 1);
    auVar42._52_4_ = (uint)bVar2 * auVar14._52_4_ | (uint)!bVar2 * auVar18._52_4_;
    bVar2 = (bool)(bVar7 >> 6 & 1);
    auVar42._56_4_ = (uint)bVar2 * auVar14._56_4_ | (uint)!bVar2 * auVar18._56_4_;
    auVar42._60_4_ =
         (uint)(bVar7 >> 7) * auVar14._60_4_ | (uint)!(bool)(bVar7 >> 7) * auVar18._60_4_;
    auVar13 = vextracti64x4_avx512f(auVar42,1);
    auVar14 = vpmulld_avx512f(auVar42,ZEXT3264(auVar13));
    auVar3 = vpmulld_avx(auVar14._0_16_,auVar14._16_16_);
    auVar4 = vpshufd_avx(auVar3,0xee);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    auVar4 = vpshufd_avx(auVar3,0x55);
    auVar3 = vpmulld_avx(auVar3,auVar4);
    uVar48 = auVar3._0_4_;
    goto LAB_0034e33c;
  }
  local_d0 = (float *)(long)(int)uVar44;
  local_b8[0] = (long)iVar46;
  local_90 = (float *)(long)(int)uVar47;
  local_e8 = (type *)dEdxi->v;
  uVar44 = 1;
  if (uVar8 != 0) {
    uVar44 = (dEdxi->d).d[0];
  }
  alStack_e0[0] = (long)(int)uVar44;
  local_158.m_data = (StoragePointerType)&local_40;
  local_158.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_e8;
  local_c0 = (type *)local_118[0];
  local_b0._M_elems[0]._0_4_ = uVar43;
  local_d8 = (DefaultDevice *)fx->v;
  local_40.m_data = (StoragePointerType)local_e8;
  local_40.m_dimensions.super_array<long,_1>._M_elems[0] =
       (array<long,_1>)(array<long,_1>)alStack_e0[0];
  Eigen::internal::
  TensorExecutor<const_Eigen::TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_Eigen::DefaultDevice,_true,_(Eigen::internal::TiledEvaluation)1>
  ::run((TensorAssignOp<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>
         *)&local_158,dev->edevice);
LAB_0034e3c6:
  std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::~vector
            ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)local_110);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if (xs[0]->d.cols() != 1) 
    throw std::runtime_error("LogSoftmax::backward not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  if(fx.d.bd == 1) {
    z.t<0>().device(*dev.edevice) = fx.t<1>().binaryExpr(dEdf.t<1>(), FWeightedError()).sum();
    Eigen::array<int, 1> bcast; bcast[0] = fx.d.rows();
    dEdxi.t<1>().device(*dev.edevice) += fx.t<1>().exp() * -z.t<1>().broadcast(bcast) + dEdf.t<1>();
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    z.tb<0>().device(*dev.edevice) = (fx.tb<1>().binaryExpr(dEdf.tb<1>(), FWeightedError())).sum(red_axis);
    Eigen::array<int, 2> bcast; bcast[0] = fx.d.rows(); bcast[1] = 1;
    dEdxi.tb<1>().device(*dev.edevice) += fx.tb<1>().exp() * -z.tb<1>().broadcast(bcast) + dEdf.tb<1>();
  }
}